

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<nwcpp::Dataflow> * __thiscall
pybind11::class_<nwcpp::Dataflow>::
def<nwcpp::Variable*(nwcpp::Dataflow::*)(std::__cxx11::string_const&)const,pybind11::arg,pybind11::return_value_policy>
          (class_<nwcpp::Dataflow> *this,char *name_,offset_in_Node_to_subr *f,arg *extra,
          return_value_policy *extra_1)

{
  offset_in_Node_to_subr f_00;
  name *extra_00;
  handle local_80;
  PyObject *local_78;
  handle local_70;
  handle local_68;
  undefined1 local_60 [16];
  is_method local_50;
  void *local_48;
  offset_in_Node_to_subr local_40;
  cpp_function local_38;
  cpp_function cf;
  return_value_policy *extra_local_1;
  arg *extra_local;
  offset_in_Node_to_subr *f_local;
  char *name__local;
  class_<nwcpp::Dataflow> *this_local;
  
  local_48 = (void *)*f;
  local_40 = f[1];
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)extra_1;
  f_00 = _nwcpp__Dataflow___pybind11__method_adaptor<nwcpp::Dataflow,nwcpp::Variable*,nwcpp::Dataflow,std::__cxx11::string_const&>_nwcpp__Variable__nwcpp__Dataflow_____std____cxx11__string_const__const__
                   (local_48,local_40);
  pybind11::name::name((name *)&local_50,name_);
  is_method::is_method((is_method *)(local_60 + 8),(handle *)this);
  local_70.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  none::none((none *)&local_80);
  local_78 = local_80.m_ptr;
  getattr((pybind11 *)&local_68,local_70,name_,local_80);
  sibling::sibling((sibling *)local_60,&local_68);
  cpp_function::
  cpp_function<nwcpp::Variable*,nwcpp::Dataflow,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::return_value_policy>
            (&local_38,f_00,extra_00,&local_50,(sibling *)(local_60 + 8),(arg *)local_60,
             (return_value_policy *)extra);
  object::~object((object *)&local_68);
  none::~none((none *)&local_80);
  detail::add_class_method((object *)this,name_,&local_38);
  cpp_function::~cpp_function(&local_38);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }